

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O0

UBool __thiscall
icu_63::CollationBuilder::ignoreString
          (CollationBuilder *this,UnicodeString *s,UErrorCode *errorCode)

{
  UBool UVar1;
  char16_t cVar2;
  undefined1 local_21;
  UErrorCode *errorCode_local;
  UnicodeString *s_local;
  CollationBuilder *this_local;
  
  UVar1 = isFCD(this,s,errorCode);
  local_21 = true;
  if (UVar1 != '\0') {
    cVar2 = UnicodeString::charAt(s,0);
    UVar1 = Hangul::isHangul((uint)(ushort)cVar2);
    local_21 = UVar1 != '\0';
  }
  return local_21;
}

Assistant:

UBool
CollationBuilder::ignoreString(const UnicodeString &s, UErrorCode &errorCode) const {
    // Do not map non-FCD strings.
    // Do not map strings that start with Hangul syllables: We decompose those on the fly.
    return !isFCD(s, errorCode) || Hangul::isHangul(s.charAt(0));
}